

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFForceManager::combineForcesAndTorques(SPFForceManager *this)

{
  RealType result;
  StuntDouble *sd;
  IntegrableObjectIterator ii;
  Molecule *mol;
  MoleculeIterator mi;
  RealType in_stack_00000150;
  RealType in_stack_00000158;
  Snapshot *in_stack_00000160;
  Snapshot *in_stack_00000168;
  StuntDouble *in_stack_00000170;
  RealType in_stack_ffffffffffffffa8;
  SPFForceManager *in_stack_ffffffffffffffb0;
  iterator *in_stack_ffffffffffffffb8;
  SimInfo *in_stack_ffffffffffffffc0;
  StuntDouble *local_28;
  Molecule *local_18;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> *)
             &stack0xfffffffffffffff0);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                       *)&stack0xffffffffffffffe0);
  Snapshot::getSPFData((Snapshot *)&stack0xffffffffffffffc0);
  std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x35771a);
  f_lambda(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x35773b);
  local_18 = SimInfo::beginMolecule
                       (in_stack_ffffffffffffffc0,(MoleculeIterator *)in_stack_ffffffffffffffb8);
  while (local_18 != (Molecule *)0x0) {
    local_28 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    while (local_28 != (StuntDouble *)0x0) {
      StuntDouble::combineForcesAndTorques
                (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
                 in_stack_00000150);
      local_28 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    local_18 = SimInfo::nextMolecule
                         (in_stack_ffffffffffffffc0,(MoleculeIterator *)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void SPFForceManager::combineForcesAndTorques() {
    // Calculate lambda-averaged forces on all atoms and potentials:
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

    // Now scale forces and torques of all the sds
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->combineForcesAndTorques(temporarySourceSnapshot_,
                                    temporarySinkSnapshot_, 1.0 - result,
                                    result);
      }
    }
  }